

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# N.cpp
# Opt level: O2

nodeit * __thiscall N::operator[](nodeit *__return_storage_ptr__,N *this,N *p)

{
  pointer puVar1;
  pointer ppNVar2;
  pointer ppNVar3;
  pointer ppNVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  long lVar8;
  
  if (p == (N *)0x0) {
    ppNVar3 = (this->os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    ppNVar4 = (this->os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
  }
  else {
    puVar1 = (this->osi).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    ppNVar3 = (this->ps).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    lVar5 = (long)(this->ps).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)ppNVar3 >> 3;
    iVar7 = 0;
    for (lVar8 = 0; (lVar6 = lVar5, lVar5 != lVar8 && (lVar6 = lVar8, ppNVar3[lVar8] != p));
        lVar8 = lVar8 + 1) {
      iVar7 = iVar7 + puVar1[lVar8];
    }
    ppNVar2 = (this->os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    ppNVar3 = (this->os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    ppNVar4 = ppNVar3;
    if ((long)ppNVar3 - (long)ppNVar2 >> 3 != (long)iVar7) {
      ppNVar3 = ppNVar2 + iVar7;
      ppNVar4 = ppNVar3 + puVar1[lVar6];
    }
  }
  (__return_storage_ptr__->_start)._M_current = ppNVar3;
  (__return_storage_ptr__->_end)._M_current = ppNVar4;
  (__return_storage_ptr__->_curr)._M_current = ppNVar3;
  __return_storage_ptr__->next =
       (CIt<__gnu_cxx::__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>,_N> *)0x0;
  return __return_storage_ptr__;
}

Assistant:

nodeit N::operator[](const N* p) {
    if (p == nullptr) return (*this).all();

    int offset = 0, i = 0;
    while (i < ps.size() and ps[i] != p) offset += osi[i++];

    if (offset == os.size()) return nodeit(os.end(), os.end());
    return nodeit(os.begin() + offset, os.begin() + offset + osi[i]);
}